

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O1

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::S2ClosestEdgeQueryBase
          (S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  pointer *__ptr;
  allocator<s2shapeutil::ShapeEdgeId> local_2c;
  equal_to<s2shapeutil::ShapeEdgeId> local_2b;
  ShapeEdgeIdHash local_2a;
  SetKey local_29;
  ShapeEdgeId local_28;
  
  (this->distance_limit_).super_S1ChordAngle.length2_ = 0.0;
  (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index_cells_).allocator_and_tag_.tag_.size_ = 0;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_28,INFINITY);
  (this->result_singleton_).distance_.super_S1ChordAngle.length2_ = (double)local_28;
  (this->result_singleton_).shape_id_ = -1;
  (this->result_singleton_).edge_id_ = -1;
  (this->result_vector_).
  super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->result_vector_).
  super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->result_vector_).
  super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->result_set_).
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .tree_.root_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_2UL,_false>
  .value = (T)0x0;
  (this->result_set_).
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)0x0;
  (this->result_set_).
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .tree_.size_ = 0;
  gtl::
  dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
  ::dense_hashtable(&(this->tested_edges_).rep,1,&local_2a,&local_2b,(Identity *)&local_28,&local_29
                    ,&local_2c);
  (this->queue_).c.allocator_and_tag_.tag_.size_ = 0;
  (this->iter_).iter_._M_t.
  super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl = (IteratorBase *)0x0;
  (this->max_distance_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->max_distance_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->max_distance_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.shape_id = -1;
  local_28.edge_id = -1;
  gtl::
  dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
  ::set_empty_key(&(this->tested_edges_).rep,&local_28);
  return;
}

Assistant:

S2ClosestEdgeQueryBase<Distance>::S2ClosestEdgeQueryBase()
    : tested_edges_(1) /* expected_max_elements*/ {
  tested_edges_.set_empty_key(ShapeEdgeId(-1, -1));
}